

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O3

void test_bson_append_utf8(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  bson_t *pbVar4;
  bson_t *b;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  code *pcVar9;
  code **ppcVar10;
  code **__haystack;
  long *plVar11;
  char *pcVar12;
  bson_t *unaff_R15;
  long lStack_c40;
  int iStack_c34;
  undefined1 auStack_c30 [8];
  char *pcStack_c28;
  undefined4 uStack_c20;
  undefined4 uStack_c1c;
  undefined2 uStack_c18;
  undefined2 uStack_c16;
  undefined4 uStack_c14;
  undefined2 uStack_c10;
  undefined8 uStack_c0e;
  undefined1 auStack_c00 [128];
  undefined1 auStack_b80 [368];
  undefined1 *puStack_a10;
  code *pcStack_a08;
  long lStack_998;
  undefined7 uStack_990;
  char cStack_989;
  undefined1 uStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [376];
  code *apcStack_788 [16];
  undefined1 auStack_708 [8];
  undefined1 auStack_700 [128];
  undefined1 auStack_680 [128];
  undefined1 auStack_600 [272];
  undefined8 uStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  bson_t *pbStack_4d8;
  undefined8 uStack_4d0;
  char *pcStack_4c8;
  char *pcStack_4c0;
  bson_t *pbStack_4b8;
  long *plStack_4b0;
  bson_t *pbStack_4a8;
  bson_t *pbStack_4a0;
  char *pcStack_498;
  code *apcStack_490 [2];
  long lStack_480;
  int iStack_478;
  int iStack_474;
  undefined1 auStack_470 [504];
  char acStack_278 [72];
  bson_t *pbStack_230;
  int iStack_18c;
  undefined1 auStack_188 [8];
  undefined1 auStack_180 [128];
  bson_t *pbStack_100;
  code *apcStack_f8 [2];
  bson_t *pbStack_e8;
  bson_t *pbStack_e0;
  bson_t *pbStack_d8;
  undefined8 uStack_c8;
  undefined4 uStack_c0;
  bson_t *pbStack_b8;
  bson_t *pbStack_b0;
  undefined8 uStack_80;
  uint8_t auStack_78 [8];
  bson_t *pbStack_70;
  bson_t *apbStack_68 [2];
  bson_t *pbStack_58;
  bson_t *apbStack_50 [2];
  bson_t *pbStack_40;
  bson_t *apbStack_38 [2];
  bson_t *pbStack_28;
  bson_t *apbStack_20 [2];
  
  apbStack_20[0] = (bson_t *)0x122113;
  pbVar3 = (bson_t *)bson_new();
  apbStack_20[0] = (bson_t *)0x122122;
  pbVar4 = get_bson("test11.bson");
  apbStack_20[0] = (bson_t *)0x122146;
  cVar1 = bson_append_utf8(pbVar3,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_20[0] = (bson_t *)0x122155;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_20[0] = (bson_t *)0x12215d;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_20[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_38[0] = (bson_t *)0x12217a;
  pbStack_28 = pbVar3;
  apbStack_20[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_38[0] = (bson_t *)0x122189;
  pbVar4 = get_bson("test32.bson");
  apbStack_38[0] = (bson_t *)0x1221ad;
  cVar1 = bson_append_symbol(pbVar3,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_38[0] = (bson_t *)0x1221bc;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_38[0] = (bson_t *)0x1221c4;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_38[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_50[0] = (bson_t *)0x1221e1;
  pbStack_40 = pbVar3;
  apbStack_38[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_50[0] = (bson_t *)0x1221fd;
  cVar1 = bson_append_time_t(pbVar3,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_50[0] = (bson_t *)0x12220d;
    pbVar4 = get_bson("test26.bson");
    apbStack_50[0] = (bson_t *)0x12221b;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_50[0] = (bson_t *)0x122223;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_50[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_68[0] = (bson_t *)0x122240;
  pbStack_58 = pbVar3;
  apbStack_50[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_68[0] = (bson_t *)0x122262;
  cVar1 = bson_append_timestamp(pbVar3,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_68[0] = (bson_t *)0x122272;
    pbVar4 = get_bson("test35.bson");
    apbStack_68[0] = (bson_t *)0x122280;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_68[0] = (bson_t *)0x122288;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_68[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)&uStack_80;
  uStack_80._0_4_ = 0x499602d2;
  uStack_80._4_4_ = 0;
  auStack_78[0] = '\0';
  auStack_78[1] = '\0';
  auStack_78[2] = '\0';
  auStack_78[3] = '\0';
  auStack_78[4] = '\0';
  auStack_78[5] = '\0';
  auStack_78[6] = '\0';
  auStack_78[7] = '\0';
  pbStack_70 = pbVar3;
  apbStack_68[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_timeval(pbVar3,"time_t",0xffffffff,b);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test26.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_timeval_cold_1();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_undefined(pbVar3,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test25.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_undefined_cold_1();
  pbStack_b8 = pbVar3;
  pbStack_b0 = b;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int32(pbVar3,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    test_bson_append_general_cold_1();
LAB_00122bb1:
    test_bson_append_general_cold_2();
LAB_00122bb6:
    test_bson_append_general_cold_3();
LAB_00122bbb:
    test_bson_append_general_cold_4();
LAB_00122bc0:
    test_bson_append_general_cold_5();
LAB_00122bc5:
    test_bson_append_general_cold_6();
LAB_00122bca:
    test_bson_append_general_cold_7();
LAB_00122bcf:
    test_bson_append_general_cold_8();
LAB_00122bd4:
    test_bson_append_general_cold_9();
LAB_00122bd9:
    test_bson_append_general_cold_10();
LAB_00122bde:
    test_bson_append_general_cold_11();
LAB_00122be3:
    test_bson_append_general_cold_12();
LAB_00122be8:
    test_bson_append_general_cold_13();
LAB_00122bed:
    test_bson_append_general_cold_14();
LAB_00122bf2:
    test_bson_append_general_cold_15();
LAB_00122bf7:
    test_bson_append_general_cold_16();
LAB_00122bfc:
    test_bson_append_general_cold_17();
LAB_00122c01:
    test_bson_append_general_cold_18();
LAB_00122c06:
    test_bson_append_general_cold_19();
LAB_00122c0b:
    test_bson_append_general_cold_20();
LAB_00122c10:
    test_bson_append_general_cold_21();
LAB_00122c15:
    test_bson_append_general_cold_22();
LAB_00122c1a:
    test_bson_append_general_cold_23();
LAB_00122c1f:
    test_bson_append_general_cold_24();
LAB_00122c24:
    test_bson_append_general_cold_25();
LAB_00122c29:
    test_bson_append_general_cold_26();
LAB_00122c2e:
    test_bson_append_general_cold_27();
LAB_00122c33:
    test_bson_append_general_cold_28();
LAB_00122c38:
    test_bson_append_general_cold_29();
LAB_00122c3d:
    test_bson_append_general_cold_30();
LAB_00122c42:
    test_bson_append_general_cold_31();
LAB_00122c47:
    test_bson_append_general_cold_32();
LAB_00122c4c:
    test_bson_append_general_cold_33();
LAB_00122c51:
    test_bson_append_general_cold_34();
LAB_00122c56:
    test_bson_append_general_cold_35();
LAB_00122c5b:
    test_bson_append_general_cold_36();
LAB_00122c60:
    test_bson_append_general_cold_37();
  }
  else {
    b = get_bson("test1.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_int64(pbVar3,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bb1;
    b = get_bson("test2.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_double(0xd916872b,pbVar3,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bb6;
    b = get_bson("test3.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bbb;
    pbVar4 = get_bson("test5.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bc0;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122bc5;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122bca;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122bcf;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122bd4;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122bd9;
    cVar1 = bson_append_array(pbVar3,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bde;
    unaff_R15 = get_bson("test6.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be3;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be8;
    cVar1 = bson_append_array(pbVar3,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bed;
    unaff_R15 = get_bson("test7.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bf2;
    cVar1 = bson_append_document(pbVar3,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bf7;
    unaff_R15 = get_bson("test8.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_null(pbVar3,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bfc;
    b = get_bson("test9.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_regex(pbVar3,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c01;
    b = get_bson("test10.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c06;
    pbVar4 = get_bson("test11.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    b = (bson_t *)bson_new();
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c0b;
    cVar1 = bson_append_double(0x33333333,pbVar3,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c10;
    cVar1 = bson_append_int32(pbVar3,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c15;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122c1a;
    unaff_R15 = get_bson("test12.bson");
    BSON_ASSERT_BSON_EQUAL(b,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    uStack_c8 = 0;
    uStack_c0 = 0x45230100;
    cVar1 = bson_append_oid(pbVar3,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c1f;
    b = (bson_t *)bson_new();
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_c8);
    if (cVar1 == '\0') goto LAB_00122c24;
    unaff_R15 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(unaff_R15,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c29;
    cVar1 = bson_append_utf8(unaff_R15,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c2e;
    cVar1 = bson_append_utf8(unaff_R15,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c33;
    cVar1 = bson_append_utf8(unaff_R15,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c38;
    cVar1 = bson_append_array(b,"tags",0xffffffff,unaff_R15);
    if (cVar1 == '\0') goto LAB_00122c3d;
    bson_destroy(unaff_R15);
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c42;
    unaff_R15 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(unaff_R15,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c47;
    cVar1 = bson_append_document(b,"source",0xffffffff,unaff_R15);
    if (cVar1 == '\0') goto LAB_00122c4c;
    bson_destroy(unaff_R15);
    cVar1 = bson_append_document(pbVar3,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c51;
    bson_destroy(b);
    b = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c56;
    cVar1 = bson_append_array(pbVar3,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c5b;
    bson_destroy(b);
    b = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c60;
    cVar1 = bson_append_array(pbVar3,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      bson_destroy(b);
      pbVar4 = get_bson("test17.bson");
      BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
      bson_destroy(pbVar4);
      bson_destroy(pbVar3);
      return;
    }
  }
  test_bson_append_general_cold_38();
  pcVar9 = (code *)0x64;
  apcStack_f8[0] = (code *)0x122c7b;
  pbStack_e8 = pbVar3;
  pbStack_e0 = b;
  pbStack_d8 = unaff_R15;
  pbVar3 = (bson_t *)bson_new();
  while( true ) {
    apcStack_f8[0] = (code *)0x122c8a;
    pbVar4 = (bson_t *)bson_new();
    apcStack_f8[0] = (code *)0x122ca0;
    cVar1 = bson_append_document(pbVar4,"a",0xffffffff,pbVar3);
    if (cVar1 == '\0') break;
    apcStack_f8[0] = (code *)0x122cac;
    bson_destroy(pbVar3);
    uVar8 = (int)pcVar9 - 1;
    pcVar9 = (code *)(ulong)uVar8;
    pbVar3 = pbVar4;
    if (uVar8 == 0) {
      apcStack_f8[0] = (code *)0x122cbf;
      pbVar3 = get_bson("test38.bson");
      apcStack_f8[0] = (code *)0x122ccd;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      apcStack_f8[0] = (code *)0x122cd5;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_f8[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_f8;
  pbStack_100 = pbVar4;
  apcStack_f8[0] = pcVar9;
  pbVar3 = get_bson("eurokey.bson");
  cVar1 = bson_validate(pbVar3,0,auStack_188);
  if (cVar1 == '\0') {
    test_bson_utf8_key_cold_1();
LAB_00122dac:
    test_bson_utf8_key_cold_2();
LAB_00122db1:
    test_bson_utf8_key_cold_3();
LAB_00122db6:
    test_bson_utf8_key_cold_4();
LAB_00122dbb:
    test_bson_utf8_key_cold_7();
LAB_00122dc0:
    test_bson_utf8_key_cold_5();
  }
  else {
    cVar1 = bson_iter_init(auStack_180,pbVar3);
    if (cVar1 == '\0') goto LAB_00122dac;
    cVar1 = bson_iter_next(auStack_180);
    if (cVar1 == '\0') goto LAB_00122db1;
    pcVar5 = (char *)bson_iter_key(auStack_180);
    iVar2 = strcmp(pcVar5,anon_var_dwarf_48e4);
    if (iVar2 != 0) goto LAB_00122db6;
    pcVar5 = (char *)bson_iter_utf8(auStack_180,&iStack_18c);
    if (pcVar5 == (char *)0x0) goto LAB_00122dbb;
    if (iStack_18c != 0xf) goto LAB_00122dc0;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_48e4);
    if (iVar2 == 0) {
      bson_destroy(pbVar3);
      return;
    }
  }
  test_bson_utf8_key_cold_6();
  pbVar4 = (bson_t *)0x1;
  pcVar12 = "test%u.bson";
  pcVar5 = acStack_278;
  plVar11 = &lStack_480;
  pbStack_230 = pbVar3;
  do {
    apcStack_490[0] = (code *)0x122e08;
    bson_snprintf(pcVar5,0x40,"test%u.bson",pbVar4);
    apcStack_490[0] = (code *)0x122e10;
    pbVar3 = get_bson(pcVar5);
    apcStack_490[0] = (code *)0x122e20;
    cVar1 = bson_validate(pbVar3,0,plVar11);
    if (cVar1 == '\0') {
      apcStack_490[0] = (code *)0x123d60;
      test_bson_validate_cold_1();
      goto LAB_00123d60;
    }
    apcStack_490[0] = (code *)0x122e30;
    bson_destroy(pbVar3);
    uVar8 = (int)pbVar4 + 1;
    pbVar4 = (bson_t *)(ulong)uVar8;
  } while (uVar8 != 0x27);
  apcStack_490[0] = (code *)0x122e43;
  pbVar4 = get_bson("codewscope.bson");
  apcStack_490[0] = (code *)0x122e55;
  cVar1 = bson_validate(pbVar4,0,&lStack_480);
  if (cVar1 == '\0') {
LAB_00123d60:
    apcStack_490[0] = (code *)0x123d65;
    test_bson_validate_cold_2();
LAB_00123d65:
    apcStack_490[0] = (code *)0x123d6a;
    test_bson_validate_cold_3();
LAB_00123d6a:
    apcStack_490[0] = (code *)0x123d6f;
    test_bson_validate_cold_158();
LAB_00123d6f:
    apcStack_490[0] = (code *)0x123d74;
    test_bson_validate_cold_157();
LAB_00123d74:
    apcStack_490[0] = (code *)0x123d79;
    test_bson_validate_cold_155();
LAB_00123d79:
    apcStack_490[0] = (code *)0x123d7e;
    test_bson_validate_cold_154();
LAB_00123d7e:
    apcStack_490[0] = (code *)0x123d83;
    test_bson_validate_cold_152();
LAB_00123d83:
    apcStack_490[0] = (code *)0x123d88;
    test_bson_validate_cold_151();
LAB_00123d88:
    apcStack_490[0] = (code *)0x123d8d;
    test_bson_validate_cold_149();
LAB_00123d8d:
    apcStack_490[0] = (code *)0x123d92;
    test_bson_validate_cold_148();
LAB_00123d92:
    apcStack_490[0] = (code *)0x123d97;
    test_bson_validate_cold_146();
LAB_00123d97:
    apcStack_490[0] = (code *)0x123d9c;
    test_bson_validate_cold_145();
LAB_00123d9c:
    apcStack_490[0] = (code *)0x123da1;
    test_bson_validate_cold_143();
LAB_00123da1:
    apcStack_490[0] = (code *)0x123da6;
    test_bson_validate_cold_142();
LAB_00123da6:
    apcStack_490[0] = (code *)0x123dab;
    test_bson_validate_cold_140();
LAB_00123dab:
    apcStack_490[0] = (code *)0x123db0;
    test_bson_validate_cold_139();
LAB_00123db0:
    apcStack_490[0] = (code *)0x123db5;
    test_bson_validate_cold_137();
LAB_00123db5:
    apcStack_490[0] = (code *)0x123dba;
    test_bson_validate_cold_136();
LAB_00123dba:
    apcStack_490[0] = (code *)0x123dbf;
    test_bson_validate_cold_134();
LAB_00123dbf:
    apcStack_490[0] = (code *)0x123dc4;
    test_bson_validate_cold_133();
LAB_00123dc4:
    apcStack_490[0] = (code *)0x123dc9;
    test_bson_validate_cold_131();
LAB_00123dc9:
    apcStack_490[0] = (code *)0x123dce;
    test_bson_validate_cold_130();
LAB_00123dce:
    apcStack_490[0] = (code *)0x123dd3;
    test_bson_validate_cold_128();
LAB_00123dd3:
    apcStack_490[0] = (code *)0x123dd8;
    test_bson_validate_cold_127();
LAB_00123dd8:
    apcStack_490[0] = (code *)0x123ddd;
    test_bson_validate_cold_125();
LAB_00123ddd:
    apcStack_490[0] = (code *)0x123de2;
    test_bson_validate_cold_124();
LAB_00123de2:
    apcStack_490[0] = (code *)0x123de7;
    test_bson_validate_cold_122();
LAB_00123de7:
    apcStack_490[0] = (code *)0x123dec;
    test_bson_validate_cold_121();
LAB_00123dec:
    apcStack_490[0] = (code *)0x123df1;
    test_bson_validate_cold_119();
LAB_00123df1:
    apcStack_490[0] = (code *)0x123df6;
    test_bson_validate_cold_118();
LAB_00123df6:
    apcStack_490[0] = (code *)0x123dfb;
    test_bson_validate_cold_116();
LAB_00123dfb:
    apcStack_490[0] = (code *)0x123e00;
    test_bson_validate_cold_115();
LAB_00123e00:
    apcStack_490[0] = (code *)0x123e05;
    test_bson_validate_cold_113();
LAB_00123e05:
    apcStack_490[0] = (code *)0x123e0a;
    test_bson_validate_cold_112();
LAB_00123e0a:
    apcStack_490[0] = (code *)0x123e0f;
    test_bson_validate_cold_110();
LAB_00123e0f:
    apcStack_490[0] = (code *)0x123e14;
    test_bson_validate_cold_109();
LAB_00123e14:
    apcStack_490[0] = (code *)0x123e19;
    test_bson_validate_cold_107();
LAB_00123e19:
    apcStack_490[0] = (code *)0x123e1e;
    test_bson_validate_cold_106();
LAB_00123e1e:
    apcStack_490[0] = (code *)0x123e23;
    test_bson_validate_cold_104();
LAB_00123e23:
    apcStack_490[0] = (code *)0x123e28;
    test_bson_validate_cold_103();
LAB_00123e28:
    apcStack_490[0] = (code *)0x123e2d;
    test_bson_validate_cold_101();
LAB_00123e2d:
    apcStack_490[0] = (code *)0x123e32;
    test_bson_validate_cold_100();
LAB_00123e32:
    apcStack_490[0] = (code *)0x123e37;
    test_bson_validate_cold_98();
LAB_00123e37:
    apcStack_490[0] = (code *)0x123e3c;
    test_bson_validate_cold_97();
LAB_00123e3c:
    apcStack_490[0] = (code *)0x123e41;
    test_bson_validate_cold_95();
LAB_00123e41:
    apcStack_490[0] = (code *)0x123e46;
    test_bson_validate_cold_94();
LAB_00123e46:
    apcStack_490[0] = (code *)0x123e4b;
    test_bson_validate_cold_92();
LAB_00123e4b:
    apcStack_490[0] = (code *)0x123e50;
    test_bson_validate_cold_91();
LAB_00123e50:
    apcStack_490[0] = (code *)0x123e55;
    test_bson_validate_cold_73();
LAB_00123e55:
    apcStack_490[0] = (code *)0x123e5a;
    test_bson_validate_cold_74();
LAB_00123e5a:
    apcStack_490[0] = (code *)0x123e5f;
    test_bson_validate_cold_75();
LAB_00123e5f:
    apcStack_490[0] = (code *)0x123e64;
    test_bson_validate_cold_89();
LAB_00123e64:
    apcStack_490[0] = (code *)0x123e69;
    test_bson_validate_cold_78();
LAB_00123e69:
    apcStack_490[0] = (code *)0x123e6e;
    test_bson_validate_cold_87();
LAB_00123e6e:
    apcStack_490[0] = (code *)0x123e73;
    test_bson_validate_cold_81();
LAB_00123e73:
    apcStack_490[0] = (code *)0x123e78;
    test_bson_validate_cold_85();
    ppcVar10 = __haystack;
LAB_00123e78:
    apcStack_490[0] = (code *)0x123e7d;
    test_bson_validate_cold_4();
LAB_00123e7d:
    apcStack_490[0] = (code *)0x123e82;
    test_bson_validate_cold_5();
    __haystack = ppcVar10;
LAB_00123e82:
    apcStack_490[0] = (code *)0x123e87;
    test_bson_validate_cold_6();
LAB_00123e87:
    apcStack_490[0] = (code *)0x123e8f;
    test_bson_validate_cold_156();
LAB_00123e8f:
    apcStack_490[0] = (code *)0x123e94;
    test_bson_validate_cold_7();
LAB_00123e94:
    apcStack_490[0] = (code *)0x123e99;
    test_bson_validate_cold_8();
LAB_00123e99:
    apcStack_490[0] = (code *)0x123e9e;
    test_bson_validate_cold_9();
LAB_00123e9e:
    apcStack_490[0] = (code *)0x123ea6;
    test_bson_validate_cold_153();
LAB_00123ea6:
    apcStack_490[0] = (code *)0x123eab;
    test_bson_validate_cold_10();
LAB_00123eab:
    apcStack_490[0] = (code *)0x123eb0;
    test_bson_validate_cold_11();
LAB_00123eb0:
    apcStack_490[0] = (code *)0x123eb5;
    test_bson_validate_cold_12();
LAB_00123eb5:
    apcStack_490[0] = (code *)0x123ebd;
    test_bson_validate_cold_150();
LAB_00123ebd:
    apcStack_490[0] = (code *)0x123ec2;
    test_bson_validate_cold_13();
LAB_00123ec2:
    apcStack_490[0] = (code *)0x123ec7;
    test_bson_validate_cold_14();
LAB_00123ec7:
    apcStack_490[0] = (code *)0x123ecc;
    test_bson_validate_cold_15();
LAB_00123ecc:
    apcStack_490[0] = (code *)0x123ed4;
    test_bson_validate_cold_147();
LAB_00123ed4:
    apcStack_490[0] = (code *)0x123ed9;
    test_bson_validate_cold_16();
LAB_00123ed9:
    apcStack_490[0] = (code *)0x123ede;
    test_bson_validate_cold_17();
LAB_00123ede:
    apcStack_490[0] = (code *)0x123ee3;
    test_bson_validate_cold_18();
LAB_00123ee3:
    apcStack_490[0] = (code *)0x123eeb;
    test_bson_validate_cold_144();
LAB_00123eeb:
    apcStack_490[0] = (code *)0x123ef0;
    test_bson_validate_cold_19();
LAB_00123ef0:
    apcStack_490[0] = (code *)0x123ef5;
    test_bson_validate_cold_20();
LAB_00123ef5:
    apcStack_490[0] = (code *)0x123efa;
    test_bson_validate_cold_21();
LAB_00123efa:
    apcStack_490[0] = (code *)0x123f02;
    test_bson_validate_cold_141();
LAB_00123f02:
    apcStack_490[0] = (code *)0x123f07;
    test_bson_validate_cold_22();
LAB_00123f07:
    apcStack_490[0] = (code *)0x123f0c;
    test_bson_validate_cold_23();
LAB_00123f0c:
    apcStack_490[0] = (code *)0x123f11;
    test_bson_validate_cold_24();
LAB_00123f11:
    apcStack_490[0] = (code *)0x123f19;
    test_bson_validate_cold_138();
LAB_00123f19:
    apcStack_490[0] = (code *)0x123f1e;
    test_bson_validate_cold_25();
LAB_00123f1e:
    apcStack_490[0] = (code *)0x123f23;
    test_bson_validate_cold_26();
LAB_00123f23:
    apcStack_490[0] = (code *)0x123f28;
    test_bson_validate_cold_27();
LAB_00123f28:
    apcStack_490[0] = (code *)0x123f30;
    test_bson_validate_cold_135();
LAB_00123f30:
    apcStack_490[0] = (code *)0x123f35;
    test_bson_validate_cold_28();
LAB_00123f35:
    apcStack_490[0] = (code *)0x123f3a;
    test_bson_validate_cold_29();
LAB_00123f3a:
    apcStack_490[0] = (code *)0x123f3f;
    test_bson_validate_cold_30();
LAB_00123f3f:
    apcStack_490[0] = (code *)0x123f47;
    test_bson_validate_cold_132();
LAB_00123f47:
    apcStack_490[0] = (code *)0x123f4c;
    test_bson_validate_cold_31();
LAB_00123f4c:
    apcStack_490[0] = (code *)0x123f51;
    test_bson_validate_cold_32();
LAB_00123f51:
    apcStack_490[0] = (code *)0x123f56;
    test_bson_validate_cold_33();
LAB_00123f56:
    apcStack_490[0] = (code *)0x123f5e;
    test_bson_validate_cold_129();
LAB_00123f5e:
    apcStack_490[0] = (code *)0x123f63;
    test_bson_validate_cold_34();
LAB_00123f63:
    apcStack_490[0] = (code *)0x123f68;
    test_bson_validate_cold_35();
LAB_00123f68:
    apcStack_490[0] = (code *)0x123f6d;
    test_bson_validate_cold_36();
LAB_00123f6d:
    apcStack_490[0] = (code *)0x123f75;
    test_bson_validate_cold_126();
LAB_00123f75:
    apcStack_490[0] = (code *)0x123f7a;
    test_bson_validate_cold_37();
LAB_00123f7a:
    apcStack_490[0] = (code *)0x123f7f;
    test_bson_validate_cold_38();
LAB_00123f7f:
    apcStack_490[0] = (code *)0x123f84;
    test_bson_validate_cold_39();
LAB_00123f84:
    apcStack_490[0] = (code *)0x123f8c;
    test_bson_validate_cold_123();
LAB_00123f8c:
    apcStack_490[0] = (code *)0x123f91;
    test_bson_validate_cold_40();
LAB_00123f91:
    apcStack_490[0] = (code *)0x123f96;
    test_bson_validate_cold_41();
LAB_00123f96:
    apcStack_490[0] = (code *)0x123f9b;
    test_bson_validate_cold_42();
LAB_00123f9b:
    apcStack_490[0] = (code *)0x123fa3;
    test_bson_validate_cold_120();
LAB_00123fa3:
    apcStack_490[0] = (code *)0x123fa8;
    test_bson_validate_cold_43();
LAB_00123fa8:
    apcStack_490[0] = (code *)0x123fad;
    test_bson_validate_cold_44();
LAB_00123fad:
    apcStack_490[0] = (code *)0x123fb2;
    test_bson_validate_cold_45();
LAB_00123fb2:
    apcStack_490[0] = (code *)0x123fba;
    test_bson_validate_cold_117();
LAB_00123fba:
    apcStack_490[0] = (code *)0x123fbf;
    test_bson_validate_cold_46();
LAB_00123fbf:
    apcStack_490[0] = (code *)0x123fc4;
    test_bson_validate_cold_47();
LAB_00123fc4:
    apcStack_490[0] = (code *)0x123fc9;
    test_bson_validate_cold_48();
LAB_00123fc9:
    apcStack_490[0] = (code *)0x123fd1;
    test_bson_validate_cold_114();
LAB_00123fd1:
    apcStack_490[0] = (code *)0x123fd6;
    test_bson_validate_cold_49();
LAB_00123fd6:
    apcStack_490[0] = (code *)0x123fdb;
    test_bson_validate_cold_50();
LAB_00123fdb:
    apcStack_490[0] = (code *)0x123fe0;
    test_bson_validate_cold_51();
LAB_00123fe0:
    apcStack_490[0] = (code *)0x123fe8;
    test_bson_validate_cold_111();
LAB_00123fe8:
    apcStack_490[0] = (code *)0x123fed;
    test_bson_validate_cold_52();
LAB_00123fed:
    apcStack_490[0] = (code *)0x123ff2;
    test_bson_validate_cold_53();
LAB_00123ff2:
    apcStack_490[0] = (code *)0x123ff7;
    test_bson_validate_cold_54();
LAB_00123ff7:
    apcStack_490[0] = (code *)0x123fff;
    test_bson_validate_cold_108();
LAB_00123fff:
    apcStack_490[0] = (code *)0x124004;
    test_bson_validate_cold_55();
LAB_00124004:
    apcStack_490[0] = (code *)0x124009;
    test_bson_validate_cold_56();
LAB_00124009:
    apcStack_490[0] = (code *)0x12400e;
    test_bson_validate_cold_57();
LAB_0012400e:
    apcStack_490[0] = (code *)0x124016;
    test_bson_validate_cold_105();
LAB_00124016:
    apcStack_490[0] = (code *)0x12401b;
    test_bson_validate_cold_58();
LAB_0012401b:
    apcStack_490[0] = (code *)0x124020;
    test_bson_validate_cold_59();
LAB_00124020:
    apcStack_490[0] = (code *)0x124025;
    test_bson_validate_cold_60();
LAB_00124025:
    apcStack_490[0] = (code *)0x12402d;
    test_bson_validate_cold_102();
LAB_0012402d:
    apcStack_490[0] = (code *)0x124032;
    test_bson_validate_cold_61();
LAB_00124032:
    apcStack_490[0] = (code *)0x124037;
    test_bson_validate_cold_62();
LAB_00124037:
    apcStack_490[0] = (code *)0x12403c;
    test_bson_validate_cold_63();
LAB_0012403c:
    apcStack_490[0] = (code *)0x124044;
    test_bson_validate_cold_99();
LAB_00124044:
    apcStack_490[0] = (code *)0x124049;
    test_bson_validate_cold_64();
LAB_00124049:
    apcStack_490[0] = (code *)0x12404e;
    test_bson_validate_cold_65();
LAB_0012404e:
    apcStack_490[0] = (code *)0x124053;
    test_bson_validate_cold_66();
LAB_00124053:
    apcStack_490[0] = (code *)0x12405b;
    test_bson_validate_cold_96();
LAB_0012405b:
    apcStack_490[0] = (code *)0x124060;
    test_bson_validate_cold_67();
LAB_00124060:
    apcStack_490[0] = (code *)0x124065;
    test_bson_validate_cold_68();
LAB_00124065:
    apcStack_490[0] = (code *)0x12406a;
    test_bson_validate_cold_69();
LAB_0012406a:
    apcStack_490[0] = (code *)0x124072;
    test_bson_validate_cold_93();
LAB_00124072:
    apcStack_490[0] = (code *)0x124077;
    test_bson_validate_cold_70();
LAB_00124077:
    apcStack_490[0] = (code *)0x12407c;
    test_bson_validate_cold_71();
LAB_0012407c:
    apcStack_490[0] = (code *)0x124081;
    test_bson_validate_cold_72();
LAB_00124081:
    apcStack_490[0] = (code *)0x124089;
    test_bson_validate_cold_90();
LAB_00124089:
    apcStack_490[0] = (code *)0x12408e;
    test_bson_validate_cold_76();
LAB_0012408e:
    apcStack_490[0] = (code *)0x124093;
    test_bson_validate_cold_77();
LAB_00124093:
    apcStack_490[0] = (code *)0x12409b;
    test_bson_validate_cold_88();
LAB_0012409b:
    apcStack_490[0] = (code *)0x1240a0;
    test_bson_validate_cold_79();
LAB_001240a0:
    apcStack_490[0] = (code *)0x1240a5;
    test_bson_validate_cold_80();
LAB_001240a5:
    apcStack_490[0] = (code *)0x1240ad;
    test_bson_validate_cold_86();
LAB_001240ad:
    apcStack_490[0] = (code *)0x1240b2;
    test_bson_validate_cold_82();
LAB_001240b2:
    apcStack_490[0] = (code *)0x1240b7;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_490[0] = (code *)0x122e65;
    bson_destroy(pbVar4);
    apcStack_490[0] = (code *)0x122e71;
    pbVar4 = get_bson("empty_key.bson");
    apcStack_490[0] = (code *)0x122e86;
    cVar1 = bson_validate(pbVar4,7,&lStack_480);
    if (cVar1 == '\0') goto LAB_00123d65;
    apcStack_490[0] = (code *)0x122e96;
    bson_destroy(pbVar4);
    apcStack_490[0] = (code *)0x122ea2;
    pcVar12 = (char *)get_bson("overflow2.bson");
    apcStack_490[0] = (code *)0x122eb4;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d6a;
    ppcVar10 = apcStack_f8;
    if (lStack_480 != 9) goto LAB_00123e78;
    apcStack_490[0] = (code *)0x122eda;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123d6f;
    ppcVar10 = apcStack_f8;
    if (iStack_478 != 3) goto LAB_00123e7d;
    __haystack = apcStack_f8;
    if (iStack_474 != 0) goto LAB_00123e82;
    __haystack = (code **)auStack_470;
    apcStack_490[0] = (code *)0x122f0f;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123e87;
    apcStack_490[0] = (code *)0x122f20;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x122f2c;
    pcVar12 = (char *)get_bson("trailingnull.bson");
    apcStack_490[0] = (code *)0x122f3e;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d74;
    if (lStack_480 != 0xe) goto LAB_00123e8f;
    apcStack_490[0] = (code *)0x122f64;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123d79;
    if (iStack_478 != 3) goto LAB_00123e94;
    if (iStack_474 != 0) goto LAB_00123e99;
    apcStack_490[0] = (code *)0x122f94;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123e9e;
    apcStack_490[0] = (code *)0x122fa5;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x122fb1;
    pcVar12 = (char *)get_bson("dollarquery.bson");
    apcStack_490[0] = (code *)0x122fc6;
    cVar1 = bson_validate(pcVar12,6,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d7e;
    if (lStack_480 != 4) goto LAB_00123ea6;
    apcStack_490[0] = (code *)0x122fef;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123d83;
    if (iStack_478 != 3) goto LAB_00123eab;
    if (iStack_474 != 2) goto LAB_00123eb0;
    apcStack_490[0] = (code *)0x123020;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar6 == (char *)0x0) goto LAB_00123eb5;
    apcStack_490[0] = (code *)0x123031;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12303d;
    pcVar12 = (char *)get_bson("dotquery.bson");
    apcStack_490[0] = (code *)0x123052;
    cVar1 = bson_validate(pcVar12,6,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d88;
    if (lStack_480 != 4) goto LAB_00123ebd;
    apcStack_490[0] = (code *)0x12307b;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123d8d;
    if (iStack_478 != 3) goto LAB_00123ec2;
    if (iStack_474 != 4) goto LAB_00123ec7;
    apcStack_490[0] = (code *)0x1230ac;
    pcVar6 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar6 == (char *)0x0) goto LAB_00123ecc;
    apcStack_490[0] = (code *)0x1230bd;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1230c9;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_490[0] = (code *)0x1230db;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d92;
    if (lStack_480 != 9) goto LAB_00123ed4;
    apcStack_490[0] = (code *)0x123101;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123d97;
    if (iStack_478 != 3) goto LAB_00123ed9;
    if (iStack_474 != 0) goto LAB_00123ede;
    apcStack_490[0] = (code *)0x123131;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123ee3;
    apcStack_490[0] = (code *)0x123142;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12314e;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_490[0] = (code *)0x123163;
    cVar1 = bson_validate(pcVar12,1,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123d9c;
    if (lStack_480 != 9) goto LAB_00123eeb;
    apcStack_490[0] = (code *)0x12318c;
    cVar1 = bson_validate_with_error(pcVar12,1,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123da1;
    if (iStack_478 != 3) goto LAB_00123ef0;
    if (iStack_474 != 0) goto LAB_00123ef5;
    apcStack_490[0] = (code *)0x1231bc;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123efa;
    apcStack_490[0] = (code *)0x1231cd;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1231d9;
    pcVar12 = (char *)get_bson("overflow4.bson");
    apcStack_490[0] = (code *)0x1231eb;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123da6;
    if (lStack_480 != 9) goto LAB_00123f02;
    apcStack_490[0] = (code *)0x123211;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123dab;
    if (iStack_478 != 3) goto LAB_00123f07;
    if (iStack_474 != 0) goto LAB_00123f0c;
    apcStack_490[0] = (code *)0x123241;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f11;
    apcStack_490[0] = (code *)0x123252;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12325e;
    pcVar12 = (char *)get_bson("empty_key.bson");
    apcStack_490[0] = (code *)0x123273;
    cVar1 = bson_validate(pcVar12,0x10,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123db0;
    if (lStack_480 != 4) goto LAB_00123f19;
    apcStack_490[0] = (code *)0x12329c;
    cVar1 = bson_validate_with_error(pcVar12,0x10,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123db5;
    if (iStack_478 != 3) goto LAB_00123f1e;
    if (iStack_474 != 0x10) goto LAB_00123f23;
    apcStack_490[0] = (code *)0x1232cd;
    pcVar6 = strstr((char *)__haystack,"empty key");
    if (pcVar6 == (char *)0x0) goto LAB_00123f28;
    apcStack_490[0] = (code *)0x1232de;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1232ea;
    pcVar12 = (char *)get_bson("test40.bson");
    apcStack_490[0] = (code *)0x1232fc;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123dba;
    if (lStack_480 != 6) goto LAB_00123f30;
    apcStack_490[0] = (code *)0x123322;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123dbf;
    if (iStack_478 != 3) goto LAB_00123f35;
    if (iStack_474 != 0) goto LAB_00123f3a;
    apcStack_490[0] = (code *)0x123352;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f3f;
    apcStack_490[0] = (code *)0x123363;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12336f;
    pcVar12 = (char *)get_bson("test41.bson");
    apcStack_490[0] = (code *)0x123381;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123dc4;
    if (lStack_480 != 6) goto LAB_00123f47;
    apcStack_490[0] = (code *)0x1233a7;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123dc9;
    if (iStack_478 != 3) goto LAB_00123f4c;
    if (iStack_474 != 0) goto LAB_00123f51;
    apcStack_490[0] = (code *)0x1233d7;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f56;
    apcStack_490[0] = (code *)0x1233e8;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1233f4;
    pcVar12 = (char *)get_bson("test42.bson");
    apcStack_490[0] = (code *)0x123406;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123dce;
    if (lStack_480 != 6) goto LAB_00123f5e;
    apcStack_490[0] = (code *)0x12342c;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123dd3;
    if (iStack_478 != 3) goto LAB_00123f63;
    if (iStack_474 != 0) goto LAB_00123f68;
    apcStack_490[0] = (code *)0x12345c;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f6d;
    apcStack_490[0] = (code *)0x12346d;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123479;
    pcVar12 = (char *)get_bson("test43.bson");
    apcStack_490[0] = (code *)0x12348b;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123dd8;
    if (lStack_480 != 6) goto LAB_00123f75;
    apcStack_490[0] = (code *)0x1234b1;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123ddd;
    if (iStack_478 != 3) goto LAB_00123f7a;
    if (iStack_474 != 0) goto LAB_00123f7f;
    apcStack_490[0] = (code *)0x1234e1;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f84;
    apcStack_490[0] = (code *)0x1234f2;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1234fe;
    pcVar12 = (char *)get_bson("test44.bson");
    apcStack_490[0] = (code *)0x123510;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123de2;
    if (lStack_480 != 6) goto LAB_00123f8c;
    apcStack_490[0] = (code *)0x123536;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123de7;
    if (iStack_478 != 3) goto LAB_00123f91;
    if (iStack_474 != 0) goto LAB_00123f96;
    apcStack_490[0] = (code *)0x123566;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f9b;
    apcStack_490[0] = (code *)0x123577;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123583;
    pcVar12 = (char *)get_bson("test45.bson");
    apcStack_490[0] = (code *)0x123595;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123dec;
    if (lStack_480 != 6) goto LAB_00123fa3;
    apcStack_490[0] = (code *)0x1235bb;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123df1;
    if (iStack_478 != 3) goto LAB_00123fa8;
    if (iStack_474 != 0) goto LAB_00123fad;
    apcStack_490[0] = (code *)0x1235eb;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fb2;
    apcStack_490[0] = (code *)0x1235fc;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123608;
    pcVar12 = (char *)get_bson("test46.bson");
    apcStack_490[0] = (code *)0x12361a;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123df6;
    if (lStack_480 != 6) goto LAB_00123fba;
    apcStack_490[0] = (code *)0x123640;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123dfb;
    if (iStack_478 != 3) goto LAB_00123fbf;
    if (iStack_474 != 0) goto LAB_00123fc4;
    apcStack_490[0] = (code *)0x123670;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fc9;
    apcStack_490[0] = (code *)0x123681;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12368d;
    pcVar12 = (char *)get_bson("test47.bson");
    apcStack_490[0] = (code *)0x12369f;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e00;
    if (lStack_480 != 6) goto LAB_00123fd1;
    apcStack_490[0] = (code *)0x1236c5;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e05;
    if (iStack_478 != 3) goto LAB_00123fd6;
    if (iStack_474 != 0) goto LAB_00123fdb;
    apcStack_490[0] = (code *)0x1236f5;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fe0;
    apcStack_490[0] = (code *)0x123706;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123712;
    pcVar12 = (char *)get_bson("test48.bson");
    apcStack_490[0] = (code *)0x123724;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e0a;
    if (lStack_480 != 6) goto LAB_00123fe8;
    apcStack_490[0] = (code *)0x12374a;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e0f;
    if (iStack_478 != 3) goto LAB_00123fed;
    if (iStack_474 != 0) goto LAB_00123ff2;
    apcStack_490[0] = (code *)0x12377a;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123ff7;
    apcStack_490[0] = (code *)0x12378b;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123797;
    pcVar12 = (char *)get_bson("test49.bson");
    apcStack_490[0] = (code *)0x1237a9;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e14;
    if (lStack_480 != 6) goto LAB_00123fff;
    apcStack_490[0] = (code *)0x1237cf;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e19;
    if (iStack_478 != 3) goto LAB_00124004;
    if (iStack_474 != 0) goto LAB_00124009;
    apcStack_490[0] = (code *)0x1237ff;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_0012400e;
    apcStack_490[0] = (code *)0x123810;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x12381c;
    pcVar12 = (char *)get_bson("test50.bson");
    apcStack_490[0] = (code *)0x12382e;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e1e;
    if (lStack_480 != 10) goto LAB_00124016;
    apcStack_490[0] = (code *)0x123854;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e23;
    if (iStack_478 != 3) goto LAB_0012401b;
    if (iStack_474 != 0) goto LAB_00124020;
    apcStack_490[0] = (code *)0x123884;
    pcVar6 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar6 == (char *)0x0) goto LAB_00124025;
    apcStack_490[0] = (code *)0x123895;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1238a1;
    pcVar12 = (char *)get_bson("test51.bson");
    apcStack_490[0] = (code *)0x1238b3;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e28;
    if (lStack_480 != 10) goto LAB_0012402d;
    apcStack_490[0] = (code *)0x1238d9;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e2d;
    if (iStack_478 != 3) goto LAB_00124032;
    if (iStack_474 != 0) goto LAB_00124037;
    apcStack_490[0] = (code *)0x123909;
    pcVar6 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar6 == (char *)0x0) goto LAB_0012403c;
    apcStack_490[0] = (code *)0x12391a;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123926;
    pcVar12 = (char *)get_bson("test52.bson");
    apcStack_490[0] = (code *)0x123938;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e32;
    if (lStack_480 != 9) goto LAB_00124044;
    apcStack_490[0] = (code *)0x12395e;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e37;
    if (iStack_478 != 3) goto LAB_00124049;
    if (iStack_474 != 0) goto LAB_0012404e;
    apcStack_490[0] = (code *)0x12398e;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124053;
    apcStack_490[0] = (code *)0x12399f;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x1239ab;
    pcVar12 = (char *)get_bson("test53.bson");
    apcStack_490[0] = (code *)0x1239bd;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e3c;
    if (lStack_480 != 6) goto LAB_0012405b;
    apcStack_490[0] = (code *)0x1239e3;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e41;
    if (iStack_478 != 3) goto LAB_00124060;
    if (iStack_474 != 0) goto LAB_00124065;
    apcStack_490[0] = (code *)0x123a13;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_0012406a;
    apcStack_490[0] = (code *)0x123a24;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123a30;
    pcVar12 = (char *)get_bson("test54.bson");
    apcStack_490[0] = (code *)0x123a42;
    cVar1 = bson_validate(pcVar12,0,&lStack_480);
    if (cVar1 != '\0') goto LAB_00123e46;
    if (lStack_480 != 0xc) goto LAB_00124072;
    apcStack_490[0] = (code *)0x123a68;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e4b;
    if (iStack_478 != 3) goto LAB_00124077;
    if (iStack_474 != 0) goto LAB_0012407c;
    apcStack_490[0] = (code *)0x123a98;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124081;
    apcStack_490[0] = (code *)0x123aa9;
    bson_destroy(pcVar12);
    apcStack_490[0] = (code *)0x123aae;
    pcVar12 = (char *)bson_bcon_magic();
    pbVar4 = (bson_t *)0x14ad57;
    plVar11 = (long *)0x14b008;
    pcStack_498 = (char *)0x0;
    pbStack_4a0 = (bson_t *)0x14ad57;
    pbStack_4a8 = (bson_t *)0x1;
    plStack_4b0 = (long *)0xf;
    pcStack_4c0 = "$id";
    pcStack_4c8 = "collection";
    uStack_4d0 = 0x123afe;
    pbStack_4b8 = (bson_t *)pcVar12;
    pcVar5 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_490[0] = (code *)0x123b14;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_478);
    if (cVar1 == '\0') goto LAB_00123e50;
    apcStack_490[0] = (code *)0x123b2e;
    cVar1 = bson_validate_with_error(pcVar5,2,&iStack_478);
    if (cVar1 == '\0') goto LAB_00123e55;
    apcStack_490[0] = (code *)0x123b3e;
    bson_destroy(pcVar5);
    pcVar5 = "$id";
    pcStack_498 = (char *)0x0;
    pbStack_4a0 = (bson_t *)0x14ad57;
    pbStack_4a8 = (bson_t *)0x1;
    plStack_4b0 = (long *)0x123b71;
    pbVar3 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar12,0xf);
    apcStack_490[0] = (code *)0x123b87;
    cVar1 = bson_validate_with_error(pbVar3,0,&iStack_478);
    if (cVar1 == '\0') goto LAB_00123e5a;
    apcStack_490[0] = (code *)0x123ba1;
    cVar1 = bson_validate_with_error(pbVar3,2,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e5f;
    if (iStack_478 != 3) goto LAB_00124089;
    if (iStack_474 != 2) goto LAB_0012408e;
    apcStack_490[0] = (code *)0x123bd2;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar6 == (char *)0x0) goto LAB_00124093;
    apcStack_490[0] = (code *)0x123be3;
    bson_destroy(pbVar3);
    pcStack_498 = (char *)0x0;
    pbStack_4a0 = (bson_t *)0x14ad57;
    pbVar3 = (bson_t *)0x147cde;
    pbStack_4a8 = (bson_t *)0x147cde;
    plStack_4b0 = (long *)0x0;
    pcStack_4c0 = "$ref";
    pcStack_4c8 = "collection";
    uStack_4d0 = 0x123c1b;
    pbStack_4b8 = (bson_t *)pcVar12;
    plVar11 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_490[0] = (code *)0x123c31;
    cVar1 = bson_validate_with_error(plVar11,0,&iStack_478);
    if (cVar1 == '\0') goto LAB_00123e64;
    apcStack_490[0] = (code *)0x123c4b;
    cVar1 = bson_validate_with_error(plVar11,2,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e69;
    if (iStack_478 != 3) goto LAB_0012409b;
    if (iStack_474 != 2) goto LAB_001240a0;
    apcStack_490[0] = (code *)0x123c7c;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar6 == (char *)0x0) goto LAB_001240a5;
    apcStack_490[0] = (code *)0x123c8d;
    bson_destroy(plVar11);
    pcStack_498 = (char *)0x0;
    pbStack_4a0 = (bson_t *)0x14ad57;
    pbStack_4a8 = (bson_t *)0x1;
    plStack_4b0 = (long *)0xf;
    pcStack_4c0 = "$id";
    pcStack_4c8 = (char *)0x2;
    uStack_4d0 = 0xf;
    pcStack_4e0 = "extra";
    pcStack_4e8 = "collection";
    uStack_4f0 = 0x123cd7;
    pbStack_4d8 = (bson_t *)pcVar12;
    pbStack_4b8 = (bson_t *)pcVar12;
    pcVar12 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_490[0] = (code *)0x123ced;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_478);
    if (cVar1 == '\0') goto LAB_00123e6e;
    apcStack_490[0] = (code *)0x123d07;
    cVar1 = bson_validate_with_error(pcVar12,2,&iStack_478);
    if (cVar1 != '\0') goto LAB_00123e73;
    if (iStack_478 != 3) goto LAB_001240ad;
    if (iStack_474 != 2) goto LAB_001240b2;
    apcStack_490[0] = (code *)0x123d38;
    pcVar6 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar6 != (char *)0x0) {
      apcStack_490[0] = (code *)0x123d49;
      bson_destroy(pcVar12);
      return;
    }
  }
  apcStack_490[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_788[0] = (code *)0x1240e7;
  pbStack_4b8 = pbVar4;
  plStack_4b0 = plVar11;
  pbStack_4a8 = pbVar3;
  pbStack_4a0 = (bson_t *)pcVar12;
  pcStack_498 = pcVar5;
  apcStack_490[0] = (code *)__haystack;
  bson_init(auStack_700);
  apcStack_788[0] = (code *)0x124106;
  bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
  apcStack_788[0] = (code *)0x124127;
  bson_append_utf8(auStack_680,"$ref",4,"foo",3);
  apcStack_788[0] = (code *)0x124132;
  bson_append_document_end(auStack_700,auStack_680);
  apcStack_788[0] = (code *)0x124144;
  cVar1 = bson_validate(auStack_700,2,auStack_708);
  if (cVar1 == '\0') {
    apcStack_788[0] = (code *)0x12415c;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124164;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124183;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x1241a4;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x1241c5;
    bson_append_utf8(auStack_680,"extra",5,"field",5);
    apcStack_788[0] = (code *)0x1241d0;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1241e2;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ab7;
    apcStack_788[0] = (code *)0x1241fa;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124202;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124223;
    bson_append_utf8(auStack_700,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x124244;
    bson_append_utf8(auStack_700,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124256;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124abc;
    apcStack_788[0] = (code *)0x12426e;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124276;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124295;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x1242b6;
    bson_append_utf8(auStack_680,"extra",5,"field",5);
    apcStack_788[0] = (code *)0x1242d7;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x1242f8;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124303;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x124315;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ac1;
    apcStack_788[0] = (code *)0x12432d;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124335;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124354;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x124375;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x124396;
    bson_append_utf8(auStack_680,"$db",3,"bar",3);
    apcStack_788[0] = (code *)0x1243a1;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1243b3;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ac6;
    apcStack_788[0] = (code *)0x1243cb;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x1243d3;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x1243f2;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x12440b;
    bson_append_int32(auStack_680,"$ref",4,1);
    apcStack_788[0] = (code *)0x12442c;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124437;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x124449;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124acb;
    apcStack_788[0] = (code *)0x124461;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124469;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124488;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x1244a1;
    bson_append_int32(auStack_680,"$ref",4,1);
    apcStack_788[0] = (code *)0x1244ac;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1244be;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ad0;
    apcStack_788[0] = (code *)0x1244d6;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x1244de;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x1244fd;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x12451e;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x12453f;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124558;
    bson_append_int32(auStack_680,"$db",3,1);
    apcStack_788[0] = (code *)0x124563;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x124575;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ad5;
    apcStack_788[0] = (code *)0x12458d;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124595;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x1245b4;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x1245d5;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x1245f6;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x12460f;
    bson_append_int32(auStack_680,"$db",3,1);
    apcStack_788[0] = (code *)0x124630;
    bson_append_utf8(auStack_680,"extra",5,"field",5);
    apcStack_788[0] = (code *)0x12463b;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x12464d;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124ada;
    apcStack_788[0] = (code *)0x124665;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x12466d;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x12468c;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x1246ad;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x1246ce;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x1246ef;
    bson_append_utf8(auStack_680,"extra",5,"field",5);
    apcStack_788[0] = (code *)0x124710;
    bson_append_utf8(auStack_680,"$db",3,"baz",3);
    apcStack_788[0] = (code *)0x12471b;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x12472d;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') goto LAB_00124adf;
    apcStack_788[0] = (code *)0x124745;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x12474d;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x12476c;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x12478d;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x1247ae;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x1247b9;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1247cb;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 == '\0') goto LAB_00124ae4;
    apcStack_788[0] = (code *)0x1247e3;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x1247eb;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x12480a;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x12482e;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x124850;
    bson_append_document_begin(auStack_680,"$id",3,auStack_600);
    apcStack_788[0] = (code *)0x12486d;
    bson_append_utf8(auStack_600,"$ref",4,"foo2",4);
    apcStack_788[0] = (code *)0x12488a;
    bson_append_utf8(auStack_600,"$id",3,"bar2",4);
    apcStack_788[0] = (code *)0x1248ae;
    bson_append_utf8(auStack_600,"$db",3,"baz2",4);
    apcStack_788[0] = (code *)0x1248b9;
    bson_append_document_end(auStack_680,auStack_600);
    apcStack_788[0] = (code *)0x1248d6;
    bson_append_utf8(auStack_680,"$db",3,"baz",3);
    apcStack_788[0] = (code *)0x1248e1;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1248f3;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 == '\0') goto LAB_00124ae9;
    apcStack_788[0] = (code *)0x12490b;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x124913;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x124932;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x124953;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x124974;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124995;
    bson_append_utf8(auStack_680,"$db",3,"baz",3);
    apcStack_788[0] = (code *)0x1249a0;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x1249b2;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 == '\0') goto LAB_00124aee;
    apcStack_788[0] = (code *)0x1249ca;
    bson_destroy(auStack_700);
    apcStack_788[0] = (code *)0x1249d2;
    bson_init(auStack_700);
    apcStack_788[0] = (code *)0x1249f1;
    bson_append_document_begin(auStack_700,"dbref",5,auStack_680);
    apcStack_788[0] = (code *)0x124a12;
    bson_append_utf8(auStack_680,"$ref",4,"foo",3);
    apcStack_788[0] = (code *)0x124a33;
    bson_append_utf8(auStack_680,"$id",3,"bar",3);
    apcStack_788[0] = (code *)0x124a54;
    bson_append_utf8(auStack_680,"$db",3,"baz",3);
    apcStack_788[0] = (code *)0x124a75;
    bson_append_utf8(auStack_680,"extra",5,"field",5);
    apcStack_788[0] = (code *)0x124a80;
    bson_append_document_end(auStack_700,auStack_680);
    apcStack_788[0] = (code *)0x124a92;
    cVar1 = bson_validate(auStack_700,2,auStack_708);
    if (cVar1 != '\0') {
      apcStack_788[0] = (code *)0x124aa3;
      bson_destroy(auStack_700);
      return;
    }
  }
  else {
    apcStack_788[0] = (code *)0x124ab7;
    test_bson_validate_dbref_cold_14();
LAB_00124ab7:
    apcStack_788[0] = (code *)0x124abc;
    test_bson_validate_dbref_cold_13();
LAB_00124abc:
    apcStack_788[0] = (code *)0x124ac1;
    test_bson_validate_dbref_cold_12();
LAB_00124ac1:
    apcStack_788[0] = (code *)0x124ac6;
    test_bson_validate_dbref_cold_11();
LAB_00124ac6:
    apcStack_788[0] = (code *)0x124acb;
    test_bson_validate_dbref_cold_10();
LAB_00124acb:
    apcStack_788[0] = (code *)0x124ad0;
    test_bson_validate_dbref_cold_9();
LAB_00124ad0:
    apcStack_788[0] = (code *)0x124ad5;
    test_bson_validate_dbref_cold_8();
LAB_00124ad5:
    apcStack_788[0] = (code *)0x124ada;
    test_bson_validate_dbref_cold_7();
LAB_00124ada:
    apcStack_788[0] = (code *)0x124adf;
    test_bson_validate_dbref_cold_6();
LAB_00124adf:
    apcStack_788[0] = (code *)0x124ae4;
    test_bson_validate_dbref_cold_5();
LAB_00124ae4:
    apcStack_788[0] = (code *)0x124ae9;
    test_bson_validate_dbref_cold_1();
LAB_00124ae9:
    apcStack_788[0] = (code *)0x124aee;
    test_bson_validate_dbref_cold_2();
LAB_00124aee:
    apcStack_788[0] = (code *)0x124af3;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_788[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_990 = 0x100620800000009;
  uStack_988 = 0;
  lStack_998 = 0;
  pcStack_a08 = (code *)0x124b38;
  apcStack_788[0] = (code *)apcStack_490;
  cVar1 = bson_init_static(auStack_900,&stack0xfffffffffffff670,9);
  if (cVar1 == '\0') {
    pcStack_a08 = (code *)0x124c37;
    test_bson_validate_bool_cold_1();
LAB_00124c37:
    pcStack_a08 = (code *)0x124c3c;
    test_bson_validate_bool_cold_2();
LAB_00124c3c:
    pcStack_a08 = (code *)0x124c41;
    test_bson_validate_bool_cold_3();
LAB_00124c41:
    pcStack_a08 = (code *)0x124c46;
    test_bson_validate_bool_cold_4();
LAB_00124c46:
    pcStack_a08 = (code *)0x124c4b;
    test_bson_validate_bool_cold_5();
LAB_00124c4b:
    pcStack_a08 = (code *)0x124c50;
    test_bson_validate_bool_cold_6();
LAB_00124c50:
    pcStack_a08 = (code *)0x124c55;
    test_bson_validate_bool_cold_7();
LAB_00124c55:
    pcStack_a08 = (code *)0x124c5a;
    test_bson_validate_bool_cold_8();
LAB_00124c5a:
    pcStack_a08 = (code *)0x124c5f;
    test_bson_validate_bool_cold_12();
LAB_00124c5f:
    pcStack_a08 = (code *)0x124c64;
    test_bson_validate_bool_cold_10();
LAB_00124c64:
    pcStack_a08 = (code *)0x124c69;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_a08 = (code *)0x124b54;
    cVar1 = bson_validate(auStack_900,0,&lStack_998);
    if (cVar1 == '\0') goto LAB_00124c37;
    pcStack_a08 = (code *)0x124b71;
    cVar1 = bson_iter_init(auStack_980,auStack_900);
    if (cVar1 == '\0') goto LAB_00124c3c;
    pcStack_a08 = (code *)0x124b86;
    cVar1 = bson_iter_next(auStack_980);
    if (cVar1 == '\0') goto LAB_00124c41;
    pcStack_a08 = (code *)0x124b9b;
    iVar2 = bson_iter_type(auStack_980);
    if (iVar2 != 8) goto LAB_00124c46;
    pcStack_a08 = (code *)0x124bb1;
    cVar1 = bson_iter_bool(auStack_980);
    if (cVar1 == '\0') goto LAB_00124c4b;
    if (cStack_989 != '\x01') goto LAB_00124c50;
    _uStack_990 = CONCAT17(0xff,uStack_990);
    pcStack_a08 = (code *)0x124bdf;
    cVar1 = bson_init_static(auStack_900,&stack0xfffffffffffff670,9);
    if (cVar1 == '\0') goto LAB_00124c55;
    pcStack_a08 = (code *)0x124bf7;
    cVar1 = bson_validate(auStack_900,0,&lStack_998);
    if (cVar1 != '\0') goto LAB_00124c5a;
    if (lStack_998 == 7) {
      pcStack_a08 = (code *)0x124c18;
      cVar1 = bson_iter_init(auStack_980,auStack_900);
      if (cVar1 == '\0') goto LAB_00124c5f;
      pcStack_a08 = (code *)0x124c29;
      cVar1 = bson_iter_next(auStack_980);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124c64;
    }
  }
  pcStack_a08 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_c10 = 0xe072;
  uStack_c0e = 0x614171c4e917c9;
  uStack_c20 = 0x1a;
  uStack_c1c = 0x200610c;
  uStack_c18 = 0;
  uStack_c16 = 0x6200;
  uStack_c14 = 0xfce15600;
  lStack_c40 = 0;
  puStack_a10 = auStack_700;
  pcStack_a08 = (code *)apcStack_788;
  cVar1 = bson_init_static(auStack_b80,&uStack_c20,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124deb:
    test_bson_validate_dbpointer_cold_2();
LAB_00124df0:
    test_bson_validate_dbpointer_cold_3();
LAB_00124df5:
    test_bson_validate_dbpointer_cold_4();
LAB_00124dfa:
    test_bson_validate_dbpointer_cold_5();
LAB_00124dff:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e04:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e09:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e0e:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e13:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e18:
    test_bson_validate_dbpointer_cold_6();
  }
  else {
    cVar1 = bson_validate(auStack_b80,0,&lStack_c40);
    if (cVar1 == '\0') goto LAB_00124deb;
    cVar1 = bson_iter_init(auStack_c00,auStack_b80);
    if (cVar1 == '\0') goto LAB_00124df0;
    cVar1 = bson_iter_next(auStack_c00);
    if (cVar1 == '\0') goto LAB_00124df5;
    iVar2 = bson_iter_type(auStack_c00);
    if (iVar2 != 0xc) goto LAB_00124dfa;
    bson_iter_dbpointer(auStack_c00,&iStack_c34,&pcStack_c28,auStack_c30);
    if ((pcStack_c28 != "b") && ((*pcStack_c28 != 'b' || (pcStack_c28[1] != '\0'))))
    goto LAB_00124e18;
    if (iStack_c34 == 1) {
      if ((char)uStack_c14 != '\0') goto LAB_00124dff;
      uStack_c14 = CONCAT31(uStack_c14._1_3_,0xff);
      cVar1 = bson_init_static(auStack_b80,&uStack_c20,0x1a);
      if (cVar1 == '\0') goto LAB_00124e04;
      cVar1 = bson_validate(auStack_b80,0,&lStack_c40);
      if (cVar1 != '\0') goto LAB_00124e09;
      if (lStack_c40 != 0xc) goto LAB_00124e22;
      cVar1 = bson_iter_init(auStack_c00,auStack_b80);
      if (cVar1 == '\0') goto LAB_00124e0e;
      cVar1 = bson_iter_next(auStack_c00);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e13;
    }
  }
  test_bson_validate_dbpointer_cold_7();
LAB_00124e22:
  test_bson_validate_dbpointer_cold_10();
  iVar2 = 1000000;
  do {
    uVar7 = bson_new();
    bson_destroy(uVar7);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_append_utf8 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   b2 = get_bson ("test11.bson");
   BSON_ASSERT (bson_append_utf8 (b, "hello", -1, "world", -1));
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}